

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::updateTiles(Board *this)

{
  unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
  *this_00;
  size_type sVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  bool bVar4;
  int iVar5;
  _Node_iterator_base<TileGate_*,_false> __it;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  TileGate *pTVar9;
  Board *pBVar10;
  ulong uVar11;
  pointer ppTVar12;
  __hashtable *__h;
  ulong uVar13;
  pointer ppTVar14;
  TileGate *gate;
  string __str;
  TileGate *local_90;
  long local_88;
  undefined1 local_80 [24];
  Vector2u local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  sVar1 = (this->switchUpdates)._M_h._M_element_count;
  if (((((this->wireUpdates)._M_h._M_element_count != 0) ||
       ((this->gateUpdates)._M_h._M_element_count != 0)) || (sVar1 != 0)) ||
     (((this->buttonUpdates)._M_h._M_element_count != 0 ||
      ((this->LEDUpdates)._M_h._M_element_count != 0)))) {
    this_00 = &this->gateUpdates;
    __it._M_cur = (__node_type *)(this->gateUpdates)._M_h._M_before_begin._M_nxt;
    if (__it._M_cur != (__node_type *)0x0) {
      do {
        bVar4 = TileGate::updateNextState(*(TileGate **)((long)__it._M_cur + 8));
        if (bVar4) {
          __it._M_cur = *__it._M_cur;
        }
        else {
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<TileGate_*,_TileGate_*,_std::allocator<TileGate_*>,_std::__detail::_Identity,_std::equal_to<TileGate_*>,_std::hash<TileGate_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::erase(&this_00->_M_h,__it._M_cur);
        }
      } while (__it._M_cur != (__node_type *)0x0);
      sVar1 = (this->switchUpdates)._M_h._M_element_count;
    }
    while (sVar1 != 0) {
      TileSwitch::updateOutput
                ((TileSwitch *)(this->switchUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
      sVar1 = (this->switchUpdates)._M_h._M_element_count;
    }
    while ((this->buttonUpdates)._M_h._M_element_count != 0) {
      TileButton::updateOutput
                ((TileButton *)(this->buttonUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    while ((this->gateUpdates)._M_h._M_element_count != 0) {
      TileGate::updateOutput((TileGate *)(this->gateUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    while ((this->wireUpdates)._M_h._M_element_count != 0) {
      TileWire::updateWire
                ((TileWire *)(this->wireUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt,LOW);
    }
    while (ppTVar2 = endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          (this->LEDUpdates)._M_h._M_element_count != 0) {
      TileLED::updateLED((TileLED *)(this->LEDUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt,LOW);
    }
    ppTVar14 = endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        TileLED::updateLED(*ppTVar14,LOW);
        ppTVar14 = ppTVar14 + 1;
      } while (ppTVar14 != ppTVar2);
      if (endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    ppTVar3 = endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppTVar12 = endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        local_90 = *ppTVar12;
        local_80._16_8_ = this_00;
        std::
        _Hashtable<TileGate*,TileGate*,std::allocator<TileGate*>,std::__detail::_Identity,std::equal_to<TileGate*>,std::hash<TileGate*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<TileGate*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<TileGate*,false>>>>
                  ((_Hashtable<TileGate*,TileGate*,std::allocator<TileGate*>,std::__detail::_Identity,std::equal_to<TileGate*>,std::hash<TileGate*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&local_90,local_80 + 0x10);
        ppTVar12 = ppTVar12 + 1;
      } while (ppTVar12 != ppTVar3);
      if (endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    TileButton::updateTransitioningButtons();
    if (Tile::currentUpdateTime == 0xffffffff) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,'\n');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,0xffffffff);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x19a0f8);
      pTVar9 = (TileGate *)(plVar6 + 2);
      if ((TileGate *)*plVar6 == pTVar9) {
        local_80._0_8_ = (pTVar9->super_Tile)._vptr_Tile;
        local_80._8_8_ = plVar6[3];
        local_90 = (TileGate *)local_80;
      }
      else {
        local_80._0_8_ = (pTVar9->super_Tile)._vptr_Tile;
        local_90 = (TileGate *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)pTVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      pBVar10 = (Board *)(plVar6 + 2);
      if ((Board *)*plVar6 == pBVar10) {
        local_60._M_allocated_capacity = (size_type)(pBVar10->super_Drawable)._vptr_Drawable;
        local_60._8_8_ = plVar6[3];
        local_80._16_8_ = &local_60;
      }
      else {
        local_60._M_allocated_capacity = (size_type)(pBVar10->super_Drawable)._vptr_Drawable;
        local_80._16_8_ = (Board *)*plVar6;
      }
      local_68 = *(Vector2u *)(plVar6 + 1);
      *plVar6 = (long)pBVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      UserInterface::pushMessage((string *)(local_80 + 0x10),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._16_8_ != &local_60) {
        operator_delete((void *)local_80._16_8_);
      }
      if (local_90 != (TileGate *)local_80) {
        operator_delete(local_90);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar8 = (this->_size).y;
      if (uVar8 != 0) {
        uVar7 = (ulong)(this->_size).x;
        uVar13 = 0;
        do {
          iVar5 = (int)uVar7;
          uVar7 = 0;
          if (iVar5 != 0) {
            uVar11 = 0;
            do {
              (*this->_tileArray[uVar13][uVar11]->_vptr_Tile[0xc])();
              uVar11 = uVar11 + 1;
              uVar7 = (ulong)(this->_size).x;
            } while (uVar11 < uVar7);
            uVar8 = (this->_size).y;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar8);
      }
      Tile::currentUpdateTime = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tiles reset.",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      Tile::currentUpdateTime = Tile::currentUpdateTime + 1;
    }
  }
  return;
}

Assistant:

void Board::updateTiles() {
    assert(endpointLEDs.empty());
    assert(endpointGates.empty());
    if (wireUpdates.empty() && gateUpdates.empty() && switchUpdates.empty() && buttonUpdates.empty() && LEDUpdates.empty()) {
        return;
    }
    /*if (!wireUpdates.empty() || !gateUpdates.empty() || !switchUpdates.empty() || !buttonUpdates.empty() || !LEDUpdates.empty()) {
        cout << "\nUpdates scheduled: w" << wireUpdates.size() << " g" << gateUpdates.size() << " s" << switchUpdates.size() << " b" << buttonUpdates.size() << " L" << LEDUpdates.size() << endl;
    }*/
    
    //cout << "---- GATE STATE CHECKS ----" << endl;
    for (auto setIter = gateUpdates.begin(); setIter != gateUpdates.end();) {    // Check state transitions for all gates (keep update only if gate changed).
        if ((*setIter)->updateNextState()) {
            ++setIter;
        } else {
            setIter = gateUpdates.erase(setIter);
        }
    }
    
    //cout << "---- SWITCH UPDATES ----" << endl;
    while (!switchUpdates.empty()) {    // Update all pending switches.
        (*switchUpdates.begin())->updateOutput();
    }
    //cout << "---- BUTTON UPDATES ----" << endl;
    while (!buttonUpdates.empty()) {    // Update all pending buttons.
        (*buttonUpdates.begin())->updateOutput();
    }
    //cout << "---- GATE UPDATES ----" << endl;
    while (!gateUpdates.empty()) {    // Update all pending gates that were left over from before.
        (*gateUpdates.begin())->updateOutput();
    }
    
    //cout << "---- REMAINING WIRES AND LEDS ----" << endl;
    while (!wireUpdates.empty()) {
        //cout << "Found a remaining wire update." << endl;
        (*wireUpdates.begin())->updateWire(LOW);
    }
    while (!LEDUpdates.empty()) {
        //cout << "Found a remaining LED update." << endl;
        (*LEDUpdates.begin())->updateLED(LOW);
    }
    
    //cout << "LED endpoints:" << endl;
    for (TileLED* LED : endpointLEDs) {
        //cout << "  (" << LED->getPosition().x << ", " << LED->getPosition().y << ")" << endl;
        LED->updateLED(LOW);
    }
    endpointLEDs.clear();
    //cout << "Gate endpoints:" << endl;
    for (TileGate* gate : endpointGates) {
        //cout << "  (" << gate->getPosition().x << ", " << gate->getPosition().y << ")" << endl;
        gateUpdates.insert(gate);
    }
    endpointGates.clear();
    
    TileButton::updateTransitioningButtons();
    //cout << endl;
    if (Tile::currentUpdateTime == numeric_limits<unsigned int>::max()) {
        UserInterface::pushMessage("Update counter has reached max value (" + to_string(numeric_limits<unsigned int>::max()) + " updates), resetting tiles...");
        for (unsigned int y = 0; y < _size.y; ++y) {
            for (unsigned int x = 0; x < _size.x; ++x) {
                _tileArray[y][x]->fixUpdateTime();
            }
        }
        Tile::currentUpdateTime = 1;
        cout << "Tiles reset." << endl;
    } else {
        ++Tile::currentUpdateTime;
    }
}